

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::PopCall(Thread *this)

{
  bool bVar1;
  reference pvVar2;
  value_type *frame;
  Thread *this_local;
  
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::pop_back(&this->frames_);
  bVar1 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::empty
                    (&this->frames_);
  if (bVar1) {
    this_local._4_4_ = Return;
  }
  else {
    pvVar2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                       (&this->frames_);
    if (pvVar2->inst == (Instance *)0x0) {
      this_local._4_4_ = Return;
    }
    else {
      this->inst_ = pvVar2->inst;
      this->mod_ = pvVar2->mod;
      this_local._4_4_ = Ok;
    }
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::PopCall() {
  frames_.pop_back();
  if (frames_.empty()) {
    return RunResult::Return;
  }

  auto& frame = frames_.back();
  if (!frame.inst) {
    // Returning to a HostFunc called on this thread.
    return RunResult::Return;
  }

  inst_ = frame.inst;
  mod_ = frame.mod;
  return RunResult::Ok;
}